

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O2

double JSON::ParseInt(wchar_t **data)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  double dVar3;
  
  dVar3 = 0.0;
  pwVar2 = *data;
  while( true ) {
    wVar1 = *pwVar2;
    if (9 < (uint)(wVar1 + L'\xffffffd0')) break;
    *data = pwVar2 + 1;
    dVar3 = dVar3 * 10.0 + (double)(wVar1 + L'\xffffffd0');
    pwVar2 = pwVar2 + 1;
  }
  return dVar3;
}

Assistant:

double JSON::ParseInt(const wchar_t **data)
{
	double integer = 0;
	while (**data != 0 && **data >= '0' && **data <= '9')
		integer = integer * 10 + (*(*data)++ - '0');
	
	return integer;
}